

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

int bb_spi_open(int pi,uint CS,uint MISO,uint MOSI,uint SCLK,uint baud,uint spiFlags)

{
  int iVar1;
  uint8_t buf [20];
  gpioExtent_t ext [1];
  
  ext[0].ptr = buf;
  ext[0].size = 0x14;
  buf._16_4_ = spiFlags;
  buf._0_4_ = MISO;
  buf._4_4_ = MOSI;
  buf._8_4_ = SCLK;
  buf._12_4_ = baud;
  iVar1 = pigpio_command_ext(pi,0x70,CS,0,0x14,1,ext,1);
  return iVar1;
}

Assistant:

int bb_spi_open(
   int pi,
   unsigned CS, unsigned MISO, unsigned MOSI, unsigned SCLK,
   unsigned baud, unsigned spiFlags)
{
   uint8_t buf[20];
   gpioExtent_t ext[1];

   /*
   p1=CS
   p2=0
   p3=20
   ## extension ##
   uint32_t MISO
   uint32_t MOSI
   uint32_t SCLK
   uint32_t baud
   uint32_t spiFlags
   */

   ext[0].size = 20;
   ext[0].ptr = &buf;

   memcpy(buf +  0, &MISO, 4);
   memcpy(buf +  4, &MOSI, 4);
   memcpy(buf +  8, &SCLK, 4);
   memcpy(buf + 12, &baud, 4);
   memcpy(buf + 16, &spiFlags, 4);

   return pigpio_command_ext
      (pi, PI_CMD_BSPIO, CS, 0, 20, 1, ext, 1);
}